

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O1

void borg_init_flow_take(void)

{
  borg_takes_cnt = 0;
  borg_takes_nxt = 1;
  borg_takes = (borg_take *)mem_zalloc(0x1800);
  return;
}

Assistant:

void borg_init_flow_take(void)
{
    /*** Object tracking ***/

    /* No objects yet */
    borg_takes_cnt = 0;
    borg_takes_nxt = 1;

    /* Array of objects */
    borg_takes = mem_zalloc(256 * sizeof(borg_take));
}